

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

ProceduralBlockSymbol *
slang::ast::ProceduralBlockSymbol::createProceduralBlock
          (Scope *scope,ProceduralBlockKind kind,SourceLocation location,bool isFromAssertion,
          MemberSyntax *syntax,StatementSyntax *stmtSyntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  pointer ppSVar1;
  ProceduralBlockSymbol *this;
  long lVar2;
  long lVar3;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar4;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> extraMembers;
  bool local_75;
  ProceduralBlockKind local_74;
  SourceLocation local_70;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> local_68;
  
  local_75 = isFromAssertion;
  local_74 = kind;
  local_70 = location;
  this = BumpAllocator::
         emplace<slang::ast::ProceduralBlockSymbol,slang::SourceLocation&,slang::ast::ProceduralBlockKind&,bool&>
                   (&scope->compilation->super_BumpAllocator,&local_70,&local_74,&local_75);
  (this->super_Symbol).originatingSyntax = &syntax->super_SyntaxNode;
  syntax_00._M_ptr =
       (syntax->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  this->stmtSyntax = stmtSyntax;
  local_68.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ =
       (pointer)local_68.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement;
  local_68.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len = 0;
  local_68.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.cap = 5;
  sVar4 = Statement::createBlockItems(scope,stmtSyntax,false,&local_68);
  this->blocks = sVar4;
  for (lVar2 = 0; ppSVar1 = local_68.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_,
      sVar4._M_extent._M_extent_value._M_extent_value << 3 != lVar2; lVar2 = lVar2 + 8) {
    stmtSyntax = *(StatementSyntax **)((long)sVar4._M_ptr + lVar2);
    Scope::addMember(scope,(Symbol *)stmtSyntax);
  }
  lVar2 = local_68.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len << 3;
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 8) {
    stmtSyntax = *(StatementSyntax **)((long)ppSVar1 + lVar3);
    Scope::addMembers(scope,&stmtSyntax->super_SyntaxNode);
  }
  SmallVectorBase<const_slang::syntax::SyntaxNode_*>::cleanup
            (&local_68.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>,
             (EVP_PKEY_CTX *)stmtSyntax);
  return this;
}

Assistant:

ProceduralBlockSymbol& ProceduralBlockSymbol::createProceduralBlock(
    Scope& scope, ProceduralBlockKind kind, SourceLocation location, bool isFromAssertion,
    const MemberSyntax& syntax, const StatementSyntax& stmtSyntax) {

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ProceduralBlockSymbol>(location, kind, isFromAssertion);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->stmtSyntax = &stmtSyntax;

    SmallVector<const SyntaxNode*> extraMembers;
    result->blocks = Statement::createBlockItems(scope, stmtSyntax, /* labelHandled */ false,
                                                 extraMembers);

    for (auto b : result->blocks)
        scope.addMember(*b);
    for (auto member : extraMembers)
        scope.addMembers(*member);

    return *result;
}